

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helicsExport.cpp
# Opt level: O1

char * helicsBrokerGetIdentifier(HelicsBroker broker)

{
  undefined8 *puVar1;
  long *plVar2;
  
  puVar1 = (undefined8 *)0x0;
  if ((broker != (HelicsBroker)0x0) && (*(int *)((long)broker + 0x14) == -0x5cb982e0)) {
    puVar1 = (undefined8 *)broker;
  }
  if (puVar1 == (undefined8 *)0x0) {
    plVar2 = (long *)0x0;
  }
  else {
    plVar2 = (long *)*puVar1;
  }
  if (plVar2 != (long *)0x0) {
    puVar1 = (undefined8 *)(**(code **)(*plVar2 + 0x58))();
    return (char *)*puVar1;
  }
  return "";
}

Assistant:

const char* helicsBrokerGetIdentifier(HelicsBroker broker)
{
    auto* brk = getBroker(broker, nullptr);
    if (brk == nullptr) {
        return nullstrPtr;
    }
    const auto& ident = brk->getIdentifier();
    return ident.c_str();
}